

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

UVec2 __thiscall
vkt::texture::util::calcLevelBounds
          (util *this,Vec2 *lodBounds,int levelCount,VkSamplerMipmapMode mipmapFilter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar6 = levelCount - 1;
  fVar9 = (float)(int)uVar6;
  *(undefined8 *)this = 0;
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
    fVar8 = lodBounds->m_data[0];
    iVar3 = 0;
    iVar2 = 0;
    if (0.5 < fVar8) {
      if (fVar9 + 0.5 <= fVar8) {
        iVar2 = (int)(*(float *)(&DAT_00b2a128 + (ulong)(uVar6 >> 0x1f) * 4) + fVar9);
      }
      else {
        fVar8 = ceilf(fVar8 + 0.5);
        iVar2 = (int)fVar8 + -1;
      }
    }
    *(int *)this = iVar2;
    fVar8 = lodBounds->m_data[1];
    if (0.5 <= fVar8) {
      if (fVar9 + 0.5 <= fVar8) {
        iVar3 = (int)(fVar9 + *(float *)(&DAT_00b2a128 + (ulong)(uVar6 >> 0x1f) * 4));
      }
      else {
        fVar9 = floorf(fVar8 + 0.5);
        iVar3 = (int)fVar9;
      }
    }
    *(int *)(this + 4) = iVar3;
  }
  else {
    fVar8 = *(float *)(&DAT_00b2a128 + (ulong)(uVar6 >> 0x1f) * 4);
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      fVar7 = lodBounds->m_data[lVar4];
      iVar2 = (int)(fVar8 + fVar9);
      if ((fVar7 < fVar9) && (iVar2 = 0, 0.0 <= fVar7)) {
        fVar7 = floorf(fVar7);
        iVar2 = (int)fVar7;
      }
      *(int *)(this + lVar4 * 4) = iVar2;
      lVar4 = 1;
      bVar1 = false;
    } while (bVar5);
  }
  return (UVec2)(uint  [2])this;
}

Assistant:

UVec2 calcLevelBounds (const Vec2&			lodBounds,
					   const int			levelCount,
					   VkSamplerMipmapMode	mipmapFilter)
{
	DE_ASSERT(lodBounds[0] <= lodBounds[1]);
	DE_ASSERT(levelCount > 0);

	const float q = (float) (levelCount - 1);

	UVec2 levelBounds;

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST)
	{
		if (lodBounds[0] <= 0.5f)
		{
			levelBounds[0] = 0;
		}
		else if (lodBounds[0] < q + 0.5f)
		{
			levelBounds[0] = deCeilFloatToInt32(lodBounds[0] + 0.5f) - 1;
		}
		else
		{
			levelBounds[0] = deRoundFloatToInt32(q);
		}

		if (lodBounds[1] < 0.5f)
		{
			levelBounds[1] = 0;
		}
		else if (lodBounds[1] < q + 0.5f)
		{
			levelBounds[1] = deFloorFloatToInt32(lodBounds[1] + 0.5f);
		}
		else
		{
			levelBounds[1] = deRoundFloatToInt32(q);
		}
	}
	else
	{
		for (int ndx = 0; ndx < 2; ++ndx)
		{
			if (lodBounds[ndx] >= q)
			{
				levelBounds[ndx] = deRoundFloatToInt32(q);
			}
			else
			{
				levelBounds[ndx] = lodBounds[ndx] < 0.0f ? 0 : deFloorFloatToInt32(lodBounds[ndx]);
			}
		}
	}

	return levelBounds;
}